

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_bbdpre.c
# Opt level: O0

int KINBBDPrecGetNumGfnEvals(void *kinmem,long *ngevalsBBDP)

{
  undefined8 *in_RSI;
  KINMem in_RDI;
  KBBDPrecData pdata;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  int local_4;
  
  if (in_RDI == (KINMem)0x0) {
    KINProcessError((KINMem)0x0,-1,0x15a,"KINBBDPrecGetNumGfnEvals",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_bbdpre.c"
                    ,"KINSOL Memory is NULL.");
    local_4 = -1;
  }
  else if (in_RDI->kin_lmem == (void *)0x0) {
    KINProcessError(in_RDI,-2,0x162,"KINBBDPrecGetNumGfnEvals",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_bbdpre.c"
                    ,
                    "Linear solver memory is NULL. One of the SPILS linear solvers must be attached."
                   );
    local_4 = -2;
  }
  else if (*(long *)((long)in_RDI->kin_lmem + 0x90) == 0) {
    KINProcessError(in_RDI,-5,0x16a,"KINBBDPrecGetNumGfnEvals",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_bbdpre.c"
                    ,"BBD peconditioner memory is NULL. IDABBDPrecInit must be called.");
    local_4 = -5;
  }
  else {
    *in_RSI = *(undefined8 *)(*(long *)((long)in_RDI->kin_lmem + 0x90) + 0x88);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int KINBBDPrecGetNumGfnEvals(void* kinmem, long int* ngevalsBBDP)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  KBBDPrecData pdata;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KINLS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_NULL);
    return (KINLS_MEM_NULL);
  }
  kin_mem = (KINMem)kinmem;

  if (kin_mem->kin_lmem == NULL)
  {
    KINProcessError(kin_mem, KINLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_LMEM_NULL);
    return (KINLS_LMEM_NULL);
  }
  kinls_mem = (KINLsMem)kin_mem->kin_lmem;

  if (kinls_mem->pdata == NULL)
  {
    KINProcessError(kin_mem, KINLS_PMEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_PMEM_NULL);
    return (KINLS_PMEM_NULL);
  }
  pdata = (KBBDPrecData)kinls_mem->pdata;

  *ngevalsBBDP = pdata->nge;

  return (KINLS_SUCCESS);
}